

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::
initiatorFixtureResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNumsHelper::RunImpl
          (initiatorFixtureResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNumsHelper
           *this)

{
  _func_int **pp_Var1;
  Message *pMVar2;
  TestResults *pTVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  int local_588 [2];
  ResendRequest local_580;
  Message resendReq;
  Message receivedLogon;
  Message sentLogon;
  int local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&sentLogon,8,8,8,0xd,5,0x7df);
  *(ulong *)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
             super_DateTime.m_date = CONCAT44(uStack_16c,local_170);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_time = CONCAT44(uStack_164,uStack_168);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&sentLogon,0x10,0x10,0x10,0xd,5,0x898);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime
  .m_date = local_170;
  *(undefined4 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
    super_DateTime.field_0xc = uStack_16c;
  *(undefined4 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
    super_DateTime.m_time = uStack_168;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
           super_DateTime.m_time + 4) = uStack_164;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = 0;
  pp_Var1 = (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
            _vptr_Responder;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  startTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                startTimeStamp.super_DateTime.m_time + 4);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  endTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
                super_DateTime.m_time + 4);
  (*pp_Var1[8])(this,1,0,0x1f);
  (this->super_initiatorFixture).super_sessionFixture.object[0x248] = (Session)0x0;
  createLogon((Logon *)&receivedLogon,"TW","ISLD",1);
  FIX::Message::Message(&sentLogon,&receivedLogon);
  FIX::Message::~Message(&receivedLogon);
  FIX::Session::send((Message *)(this->super_initiatorFixture).super_sessionFixture.object);
  FIX::Session::next();
  FIX::Session::logon((this->super_initiatorFixture).super_sessionFixture.object);
  createLogon((Logon *)&resendReq,"ISLD","TW",1);
  FIX::Message::Message(&receivedLogon,&resendReq);
  FIX::Message::~Message(&resendReq);
  pMVar2 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&resendReq);
  FIX::Session::next(pMVar2,(UtcTimeStamp *)&receivedLogon,SUB81(&resendReq,0));
  FIX::SessionState::setNextSenderMsgSeqNum
            ((SessionState *)((this->super_initiatorFixture).super_sessionFixture.object + 0x250),5)
  ;
  createResendRequest(&local_580,"ISLD","TW",2,1,10);
  FIX::Message::Message(&resendReq,(Message *)&local_580);
  FIX::Message::~Message((Message *)&local_580);
  pMVar2 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_580);
  FIX::Session::next(pMVar2,(UtcTimeStamp *)&resendReq,SUB81(&local_580,0));
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar3 = *ppTVar4;
  local_588[1] = 5;
  local_588[0] = FIX::SessionState::getNextSenderMsgSeqNum
                           ((SessionState *)
                            ((this->super_initiatorFixture).super_sessionFixture.object + 0x250));
  ppTVar5 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_580,*ppTVar5,0x818);
  UnitTest::CheckEqual<int,int>(pTVar3,local_588 + 1,local_588,(TestDetails *)&local_580);
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar3 = *ppTVar4;
  local_588[1] = 2;
  local_588[0] = FIX::SessionState::getNextTargetMsgSeqNum
                           ((SessionState *)
                            ((this->super_initiatorFixture).super_sessionFixture.object + 0x250));
  ppTVar5 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_580,*ppTVar5,0x819);
  UnitTest::CheckEqual<int,int>(pTVar3,local_588 + 1,local_588,(TestDetails *)&local_580);
  FIX::Message::~Message(&resendReq);
  FIX::Message::~Message(&receivedLogon);
  FIX::Message::~Message(&sentLogon);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, ResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNums) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  object->setPersistMessages(false);

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  object->setNextSenderMsgSeqNum(5);

  FIX::Message resendReq = createResendRequest( "ISLD", "TW", 2, 1, 10);
  object->next(resendReq, UtcTimeStamp());

  CHECK_EQUAL(5, object->getExpectedSenderNum());
  CHECK_EQUAL(2, object->getExpectedTargetNum());

}